

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chess.cpp
# Opt level: O3

Result * __thiscall
banksia::ChessBoard::probeSyzygy
          (Result *__return_storage_ptr__,ChessBoard *this,int maxPieces,bool *tberror)

{
  Side SVar1;
  pointer pPVar2;
  Piece PVar3;
  int iVar4;
  uint64_t queens;
  bool bVar5;
  uint64_t kings;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  uint64_t rooks;
  uint64_t bishops;
  uint64_t knights;
  uint64_t pawns;
  long lVar10;
  char cVar11;
  char cVar12;
  PieceType PVar13;
  uint64_t bm [2];
  uint results [193];
  
  *tberror = false;
  Result::Result(__return_storage_ptr__);
  if (((Tablebase::SyzygyTablebase::TB_LARGEST != 0) &&
      (iVar4 = toPieceCount(this,(int *)0x0), iVar4 <= maxPieces)) &&
     (iVar4 <= Tablebase::SyzygyTablebase::TB_LARGEST)) {
    bm[0] = 0;
    bm[1] = 0;
    pPVar2 = (this->super_BoardCore).pieces.
             super__Vector_base<banksia::Piece,_std::allocator<banksia::Piece>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar8 = (long)(this->super_BoardCore).pieces.
                  super__Vector_base<banksia::Piece,_std::allocator<banksia::Piece>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pPVar2 >> 3;
    lVar10 = 0;
    pawns = 0;
    knights = 0;
    bishops = 0;
    rooks = 0;
    queens = 0;
    kings = 0;
    do {
      if (lVar8 == lVar10) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",lVar8
                   ,lVar8);
      }
      PVar3 = pPVar2[lVar10];
      PVar13 = PVar3.type;
      if (PVar13 != empty) {
        uVar6 = 1L << (((byte)lVar10 ^ 0x38) & 0x3f);
        bm[(long)PVar3 >> 0x20] = bm[(long)PVar3 >> 0x20] | uVar6;
        switch(PVar13) {
        case king:
          kings = kings | uVar6;
          break;
        case queen:
          queens = queens | uVar6;
          break;
        case rook:
          rooks = rooks | uVar6;
          break;
        case bishop:
          bishops = bishops | uVar6;
          break;
        case knight:
          knights = knights | uVar6;
          break;
        case pawn:
          pawns = pawns | uVar6;
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x40);
    uVar9 = (uint)this->castleRights[0];
    uVar7 = (uint)this->castleRights[1];
    bVar5 = true;
    if (uVar9 + uVar7 != 0) {
      cVar11 = ((this->CastleRight_short & uVar9) != 0) * '\x04';
      cVar12 = cVar11 + '\b';
      if ((this->CastleRight_long & uVar9) == 0) {
        cVar12 = cVar11;
      }
      bVar5 = ((this->CastleRight_short & uVar7) == 0 && cVar12 == '\0') &&
              (this->CastleRight_long & uVar7) == 0;
    }
    uVar7 = this->enpassant;
    if ((int)uVar7 < 1) {
      uVar7 = 0;
    }
    else {
      uVar7 = ((uVar7 & 7) - (uVar7 & 0xf8)) + 0x38 & 0xff;
    }
    if (bVar5) {
      SVar1 = (this->super_BoardCore).side;
      uVar7 = Tablebase::SyzygyTablebase::tb_probe_root_impl
                        (bm[1],bm[0],kings,queens,rooks,bishops,knights,pawns,
                         (uint)(byte)(this->super_BoardCore).quietCnt,uVar7,SVar1 == white,results);
      if (uVar7 != 0xffffffff) {
        uVar9 = 4 - (uVar7 & 0xf);
        if (SVar1 == white) {
          uVar9 = uVar7 & 0xf;
        }
        __return_storage_ptr__->result = probeSyzygy::typeArray[uVar9];
        __return_storage_ptr__->reason = adjudication;
        return __return_storage_ptr__;
      }
    }
    *tberror = true;
  }
  return __return_storage_ptr__;
}

Assistant:

Result ChessBoard::probeSyzygy(int maxPieces, bool& tberror) const
{
    tberror = false;
    Result result;
    if (!Tablebase::SyzygyTablebase::TB_LARGEST) {
        return result;
    }
    
    auto total = toPieceCount(nullptr);
    if (total > maxPieces || total > Tablebase::SyzygyTablebase::TB_LARGEST) {
        return result;
    }
    
    SyzygyPos pos;
    memset(&pos, 0, sizeof(pos));
    
    uint64_t bm[2] = { 0, 0 };
    
    for(int i = 0; i < 64; i++) {
        auto piece = getPiece(i);
        if (piece.isEmpty()) continue;
        auto sd = static_cast<int>(piece.side);
        
        uint64_t b = 1ULL << ((7 - (i >> 3)) * 8 + (i & 0x7));
        bm[sd] |= b;
        
        switch (piece.type) {
            case PieceType::king:
                pos.kings |= b;
                break;
            case PieceType::queen:
                pos.queens |= b;
                break;
            case PieceType::rook:
                pos.rooks |= b;
                break;
            case PieceType::bishop:
                pos.bishops |= b;
                break;
            case PieceType::knight:
                pos.knights |= b;
                break;
            case PieceType::pawn:
                pos.pawns |= b;
                break;
                
            default:
                break;
        }
    }
    
    pos.white = bm[W];
    pos.black = bm[B];
    pos.turn = side == Side::white ? 1 : 0;
    
    if (castleRights[0] + castleRights[1]) {
        if (castleRights[B] & CastleRight_short) {
            pos.castling |= TB_CASTLING_k;
        }
        if (castleRights[B] & CastleRight_long) {
            pos.castling |= TB_CASTLING_q;
        }
        if (castleRights[W] & CastleRight_short) {
            pos.castling |= TB_CASTLING_K;
        }
        if (castleRights[W] & CastleRight_long) {
            pos.castling |= TB_CASTLING_Q;
        }
    }
    
    if (enpassant > 0) {
        pos.ep = (7 - (enpassant >> 3)) * 8 + (enpassant & 0x7);
    }
    
    pos.rule50 = quietCnt;
    
    unsigned results[TB_MAX_MOVES];
    unsigned res = Tablebase::SyzygyTablebase::tb_probe_root(pos.white, pos.black, pos.kings,
                                            pos.queens, pos.rooks, pos.bishops, pos.knights, pos.pawns,
                                            pos.rule50, pos.castling, pos.ep, pos.turn, results);
    if (res == TB_RESULT_FAILED)
    {
//        printOut();
//        std::cerr << "Error: unable to probe tablebase; position invalid, illegal or not in tablebase" << std::endl;
        tberror = true;
        return result;
    }
    
    // (3) Output:
    unsigned wdl = TB_GET_WDL(res);
    
    static const ResultType typeArray[] = {
        ResultType::loss,
        ResultType::draw, ResultType::draw, ResultType::draw,
        ResultType::win
    };
    
    result.result = typeArray[pos.turn? wdl: 4 - wdl];
    result.reason = ReasonType::adjudication;
    return result;
}